

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_address.cpp
# Opt level: O1

void __thiscall
Address_SegwitAddressFromStringTest_Test::TestBody(Address_SegwitAddressFromStringTest_Test *this)

{
  bool bVar1;
  pointer pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *__dest;
  ulong uVar4;
  size_t sVar5;
  char *pcVar6;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_1;
  Address address;
  AssertHelper local_348;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_340;
  string local_338;
  undefined1 local_318 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_310;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_308;
  char local_2f8 [16];
  pointer local_2e8;
  pointer local_2d0;
  pointer local_2b8;
  TapBranch local_2a0;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_228;
  Script local_210;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1d0;
  Address local_1a0;
  
  cfd::core::Address::Address(&local_1a0);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_338,"bc1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5uax7v9q","");
      cfd::core::Address::Address((Address *)local_318,&local_338);
      cfd::core::Address::operator=(&local_1a0,(Address *)local_318);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_1d0);
      cfd::core::Script::~Script(&local_210);
      local_2a0._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_006a68b0;
      std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                (&local_228);
      cfd::core::TapBranch::~TapBranch(&local_2a0);
      if (local_2b8 != (pointer)0x0) {
        operator_delete(local_2b8);
      }
      if (local_2d0 != (pointer)0x0) {
        operator_delete(local_2d0);
      }
      if (local_2e8 != (pointer)0x0) {
        operator_delete(local_2e8);
      }
      if ((char *)local_308._M_allocated_capacity != local_2f8) {
        operator_delete((void *)local_308._M_allocated_capacity);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_338._M_dataplus._M_p != &local_338.field_2) {
        operator_delete(local_338._M_dataplus._M_p);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_318);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_338,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x1aa,
               "Expected: (address = Address(\"bc1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5uax7v9q\")) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_338,(Message *)local_318);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_338);
    if (local_318 != (undefined1  [8])0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_318 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_318 + 8))();
      }
      local_318 = (undefined1  [8])0x0;
    }
  }
  cfd::core::Address::GetAddress_abi_cxx11_((string *)local_318,&local_1a0);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_338,"\"bc1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5uax7v9q\"",
             "address.GetAddress().c_str()","bc1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5uax7v9q",
             (char *)local_318);
  if (local_318 != (undefined1  [8])&local_308) {
    operator_delete((void *)local_318);
  }
  if ((char)local_338._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_318);
    if ((undefined8 *)local_338._M_string_length == (undefined8 *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)local_338._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x1ac,pcVar6);
    testing::internal::AssertHelper::operator=(&local_348,(Message *)local_318);
    testing::internal::AssertHelper::~AssertHelper(&local_348);
    if (local_318 != (undefined1  [8])0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_318 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_318 + 8))();
      }
      local_318 = (undefined1  [8])0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_338._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_338._M_dataplus._M_p = local_338._M_dataplus._M_p & 0xffffffff00000000;
  local_348.data_._0_4_ = local_1a0.type_;
  testing::internal::CmpHelperEQ<cfd::core::NetType,cfd::core::NetType>
            ((internal *)local_318,"NetType::kMainnet","address.GetNetType()",(NetType *)&local_338,
             (NetType *)&local_348);
  if (local_318[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_338);
    if (local_310.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((local_310.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x1ad,pcVar6);
    testing::internal::AssertHelper::operator=(&local_348,(Message *)&local_338);
    testing::internal::AssertHelper::~AssertHelper(&local_348);
    if ((long *)local_338._M_dataplus._M_p != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_338._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_338._M_dataplus._M_p + 8))();
      }
      local_338._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_310,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_338._M_dataplus._M_p._0_4_ = 4;
  local_348.data_._0_4_ = local_1a0.addr_type_;
  testing::internal::CmpHelperEQ<cfd::core::AddressType,cfd::core::AddressType>
            ((internal *)local_318,"AddressType::kP2wpkhAddress","address.GetAddressType()",
             (AddressType *)&local_338,(AddressType *)&local_348);
  if (local_318[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_338);
    if (local_310.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((local_310.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x1ae,pcVar6);
    testing::internal::AssertHelper::operator=(&local_348,(Message *)&local_338);
    testing::internal::AssertHelper::~AssertHelper(&local_348);
    if ((long *)local_338._M_dataplus._M_p != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_338._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_338._M_dataplus._M_p + 8))();
      }
      local_338._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_310,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_338._M_dataplus._M_p = local_338._M_dataplus._M_p & 0xffffffff00000000;
  local_348.data_._0_4_ = local_1a0.witness_ver_;
  testing::internal::CmpHelperEQ<cfd::core::WitnessVersion,cfd::core::WitnessVersion>
            ((internal *)local_318,"WitnessVersion::kVersion0","address.GetWitnessVersion()",
             (WitnessVersion *)&local_338,(WitnessVersion *)&local_348);
  if (local_318[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_338);
    if (local_310.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((local_310.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x1af,pcVar6);
    testing::internal::AssertHelper::operator=(&local_348,(Message *)&local_338);
    testing::internal::AssertHelper::~AssertHelper(&local_348);
    if ((long *)local_338._M_dataplus._M_p != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_338._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_338._M_dataplus._M_p + 8))();
      }
      local_338._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_310,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_338._M_dataplus._M_p = (pointer)0x0;
  local_338._M_string_length = 0;
  local_338.field_2._M_allocated_capacity = 0;
  uVar4 = (long)local_1a0.hash_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_1a0.hash_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (uVar4 == 0) {
    pcVar2 = (pointer)0x0;
  }
  else {
    if ((long)uVar4 < 0) {
      std::__throw_bad_alloc();
    }
    pcVar2 = (pointer)operator_new(uVar4);
  }
  local_338.field_2._M_allocated_capacity = (size_type)(pcVar2 + uVar4);
  sVar5 = (long)local_1a0.hash_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_1a0.hash_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  local_338._M_dataplus._M_p = pcVar2;
  if (sVar5 != 0) {
    local_338._M_string_length = (size_type)pcVar2;
    memmove(pcVar2,local_1a0.hash_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,sVar5);
  }
  local_338._M_string_length = (size_type)(pcVar2 + sVar5);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_318,(ByteData *)&local_338);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_348,"\"925d4028880bd0c9d68fbc7fc7dfee976698629c\"",
             "address.GetHash().GetHex().c_str()","925d4028880bd0c9d68fbc7fc7dfee976698629c",
             (char *)local_318);
  if (local_318 != (undefined1  [8])&local_308) {
    operator_delete((void *)local_318);
  }
  if (local_338._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_338._M_dataplus._M_p);
  }
  if (local_348.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_318);
    if (local_340.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((local_340.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_338,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x1b1,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_338,(Message *)local_318);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_338);
    if (local_318 != (undefined1  [8])0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_318 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_318 + 8))();
      }
      local_318 = (undefined1  [8])0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_340,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_338._M_dataplus._M_p = (pointer)0x0;
  local_338._M_string_length = 0;
  local_338.field_2._M_allocated_capacity = 0;
  uVar4 = (long)local_1a0.pubkey_.data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_1a0.pubkey_.data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (uVar4 == 0) {
    paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
  }
  else {
    if ((long)uVar4 < 0) {
      std::__throw_bad_alloc();
    }
    paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)operator_new(uVar4);
  }
  local_338.field_2._M_allocated_capacity = uVar4 + (long)paVar3;
  sVar5 = (long)local_1a0.pubkey_.data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_1a0.pubkey_.data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  local_338._M_dataplus._M_p = (pointer)paVar3;
  if (sVar5 != 0) {
    local_338._M_string_length = (size_type)paVar3;
    memmove(paVar3,local_1a0.pubkey_.data_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,sVar5);
  }
  local_338._M_string_length = (long)paVar3 + sVar5;
  cfd::core::Pubkey::GetHex_abi_cxx11_((string *)local_318,(Pubkey *)&local_338);
  pcVar6 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_348,"\"\"","address.GetPubkey().GetHex().c_str()","",
             (char *)local_318);
  if (local_318 != (undefined1  [8])&local_308) {
    operator_delete((void *)local_318);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_338._M_dataplus._M_p);
  }
  if (local_348.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_318);
    if (local_340.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar6 = ((local_340.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_338,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x1b2,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_338,(Message *)local_318);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_338);
    if (local_318 != (undefined1  [8])0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_318 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_318 + 8))();
      }
      local_318 = (undefined1  [8])0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_340,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Script::Script((Script *)local_318,&local_1a0.redeem_script_);
  cfd::core::Script::GetHex_abi_cxx11_(&local_338,(Script *)local_318);
  pcVar6 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_348,"\"\"","address.GetScript().GetHex().c_str()","",
             local_338._M_dataplus._M_p);
  paVar3 = &local_338.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._M_dataplus._M_p != paVar3) {
    operator_delete(local_338._M_dataplus._M_p);
  }
  cfd::core::Script::~Script((Script *)local_318);
  if (local_348.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_318);
    if (local_340.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar6 = ((local_340.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_338,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x1b3,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_338,(Message *)local_318);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_338);
    if (local_318 != (undefined1  [8])0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_318 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_318 + 8))();
      }
      local_318 = (undefined1  [8])0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_340,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_338._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_338,
                 "tb1qcc5c9wnzly8zj2dcsvxv83kupsu0uamx69u0y9lsmw7shuns2gqs44ltpt","");
      cfd::core::Address::Address((Address *)local_318,&local_338);
      cfd::core::Address::operator=(&local_1a0,(Address *)local_318);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_1d0);
      cfd::core::Script::~Script(&local_210);
      local_2a0._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_006a68b0;
      std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                (&local_228);
      cfd::core::TapBranch::~TapBranch(&local_2a0);
      if (local_2b8 != (pointer)0x0) {
        operator_delete(local_2b8);
      }
      if (local_2d0 != (pointer)0x0) {
        operator_delete(local_2d0);
      }
      if (local_2e8 != (pointer)0x0) {
        operator_delete(local_2e8);
      }
      if ((char *)local_308._M_allocated_capacity != local_2f8) {
        operator_delete((void *)local_308._M_allocated_capacity);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_338._M_dataplus._M_p != paVar3) {
        operator_delete(local_338._M_dataplus._M_p);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_318);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_338,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x1b5,
               "Expected: (address = Address(\"tb1qcc5c9wnzly8zj2dcsvxv83kupsu0uamx69u0y9lsmw7shuns2gqs44ltpt\")) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_338,(Message *)local_318);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_338);
    if (local_318 != (undefined1  [8])0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_318 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_318 + 8))();
      }
      local_318 = (undefined1  [8])0x0;
    }
  }
  cfd::core::Address::GetAddress_abi_cxx11_((string *)local_318,&local_1a0);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_338,
             "\"tb1qcc5c9wnzly8zj2dcsvxv83kupsu0uamx69u0y9lsmw7shuns2gqs44ltpt\"",
             "address.GetAddress().c_str()",
             "tb1qcc5c9wnzly8zj2dcsvxv83kupsu0uamx69u0y9lsmw7shuns2gqs44ltpt",(char *)local_318);
  if (local_318 != (undefined1  [8])&local_308) {
    operator_delete((void *)local_318);
  }
  if ((char)local_338._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_318);
    if ((undefined8 *)local_338._M_string_length == (undefined8 *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)local_338._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x1b7,pcVar6);
    testing::internal::AssertHelper::operator=(&local_348,(Message *)local_318);
    testing::internal::AssertHelper::~AssertHelper(&local_348);
    if (local_318 != (undefined1  [8])0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_318 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_318 + 8))();
      }
      local_318 = (undefined1  [8])0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_338._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_338._M_dataplus._M_p._0_4_ = 1;
  local_348.data_._0_4_ = local_1a0.type_;
  testing::internal::CmpHelperEQ<cfd::core::NetType,cfd::core::NetType>
            ((internal *)local_318,"NetType::kTestnet","address.GetNetType()",(NetType *)&local_338,
             (NetType *)&local_348);
  if (local_318[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_338);
    if (local_310.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((local_310.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x1b8,pcVar6);
    testing::internal::AssertHelper::operator=(&local_348,(Message *)&local_338);
    testing::internal::AssertHelper::~AssertHelper(&local_348);
    if ((long *)local_338._M_dataplus._M_p != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_338._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_338._M_dataplus._M_p + 8))();
      }
      local_338._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_310,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_338._M_dataplus._M_p._0_4_ = 3;
  local_348.data_._0_4_ = local_1a0.addr_type_;
  testing::internal::CmpHelperEQ<cfd::core::AddressType,cfd::core::AddressType>
            ((internal *)local_318,"AddressType::kP2wshAddress","address.GetAddressType()",
             (AddressType *)&local_338,(AddressType *)&local_348);
  if (local_318[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_338);
    if (local_310.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((local_310.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x1b9,pcVar6);
    testing::internal::AssertHelper::operator=(&local_348,(Message *)&local_338);
    testing::internal::AssertHelper::~AssertHelper(&local_348);
    if ((long *)local_338._M_dataplus._M_p != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_338._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_338._M_dataplus._M_p + 8))();
      }
      local_338._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_310,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_338._M_dataplus._M_p = local_338._M_dataplus._M_p & 0xffffffff00000000;
  local_348.data_._0_4_ = local_1a0.witness_ver_;
  testing::internal::CmpHelperEQ<cfd::core::WitnessVersion,cfd::core::WitnessVersion>
            ((internal *)local_318,"WitnessVersion::kVersion0","address.GetWitnessVersion()",
             (WitnessVersion *)&local_338,(WitnessVersion *)&local_348);
  if (local_318[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_338);
    if (local_310.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((local_310.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x1ba,pcVar6);
    testing::internal::AssertHelper::operator=(&local_348,(Message *)&local_338);
    testing::internal::AssertHelper::~AssertHelper(&local_348);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_338._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_338._M_dataplus._M_p + 8))();
      }
      local_338._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_310,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_338._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_338,"bcrt1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5u4fujf6","");
      cfd::core::Address::Address((Address *)local_318,&local_338);
      cfd::core::Address::operator=(&local_1a0,(Address *)local_318);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_1d0);
      cfd::core::Script::~Script(&local_210);
      local_2a0._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_006a68b0;
      std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                (&local_228);
      cfd::core::TapBranch::~TapBranch(&local_2a0);
      if (local_2b8 != (pointer)0x0) {
        operator_delete(local_2b8);
      }
      if (local_2d0 != (pointer)0x0) {
        operator_delete(local_2d0);
      }
      if (local_2e8 != (pointer)0x0) {
        operator_delete(local_2e8);
      }
      if ((char *)local_308._M_allocated_capacity != local_2f8) {
        operator_delete((void *)local_308._M_allocated_capacity);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_338._M_dataplus._M_p != paVar3) {
        operator_delete(local_338._M_dataplus._M_p);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_318);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_338,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x1bc,
               "Expected: (address = Address(\"bcrt1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5u4fujf6\")) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_338,(Message *)local_318);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_338);
    if (local_318 != (undefined1  [8])0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_318 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_318 + 8))();
      }
      local_318 = (undefined1  [8])0x0;
    }
  }
  cfd::core::Address::GetAddress_abi_cxx11_((string *)local_318,&local_1a0);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_338,"\"bcrt1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5u4fujf6\"",
             "address.GetAddress().c_str()","bcrt1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5u4fujf6",
             (char *)local_318);
  if (local_318 != (undefined1  [8])&local_308) {
    operator_delete((void *)local_318);
  }
  if ((char)local_338._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_318);
    if ((undefined8 *)local_338._M_string_length == (undefined8 *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)local_338._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x1be,pcVar6);
    testing::internal::AssertHelper::operator=(&local_348,(Message *)local_318);
    testing::internal::AssertHelper::~AssertHelper(&local_348);
    if (local_318 != (undefined1  [8])0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_318 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_318 + 8))();
      }
      local_318 = (undefined1  [8])0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_338._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_338._M_dataplus._M_p._0_4_ = 2;
  local_348.data_._0_4_ = local_1a0.type_;
  testing::internal::CmpHelperEQ<cfd::core::NetType,cfd::core::NetType>
            ((internal *)local_318,"NetType::kRegtest","address.GetNetType()",(NetType *)&local_338,
             (NetType *)&local_348);
  if (local_318[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_338);
    if (local_310.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((local_310.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x1bf,pcVar6);
    testing::internal::AssertHelper::operator=(&local_348,(Message *)&local_338);
    testing::internal::AssertHelper::~AssertHelper(&local_348);
    if ((long *)local_338._M_dataplus._M_p != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_338._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_338._M_dataplus._M_p + 8))();
      }
      local_338._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_310,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_338._M_dataplus._M_p._0_4_ = 4;
  local_348.data_._0_4_ = local_1a0.addr_type_;
  testing::internal::CmpHelperEQ<cfd::core::AddressType,cfd::core::AddressType>
            ((internal *)local_318,"AddressType::kP2wpkhAddress","address.GetAddressType()",
             (AddressType *)&local_338,(AddressType *)&local_348);
  if (local_318[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_338);
    if (local_310.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((local_310.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x1c0,pcVar6);
    testing::internal::AssertHelper::operator=(&local_348,(Message *)&local_338);
    testing::internal::AssertHelper::~AssertHelper(&local_348);
    if ((long *)local_338._M_dataplus._M_p != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_338._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_338._M_dataplus._M_p + 8))();
      }
      local_338._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_310,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_338._M_dataplus._M_p = local_338._M_dataplus._M_p & 0xffffffff00000000;
  local_348.data_._0_4_ = local_1a0.witness_ver_;
  testing::internal::CmpHelperEQ<cfd::core::WitnessVersion,cfd::core::WitnessVersion>
            ((internal *)local_318,"WitnessVersion::kVersion0","address.GetWitnessVersion()",
             (WitnessVersion *)&local_338,(WitnessVersion *)&local_348);
  if (local_318[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_338);
    if (local_310.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((local_310.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x1c1,pcVar6);
    testing::internal::AssertHelper::operator=(&local_348,(Message *)&local_338);
    testing::internal::AssertHelper::~AssertHelper(&local_348);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_338._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_338._M_dataplus._M_p + 8))();
      }
      local_338._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_310,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_338._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_338,
                 "bcrt1pzamhq9jglfxaj0r5ahvatr8uc77u973s5tm04yytdltsey5r8nasmsdlvq","");
      cfd::core::Address::Address((Address *)local_318,&local_338);
      cfd::core::Address::operator=(&local_1a0,(Address *)local_318);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_1d0);
      cfd::core::Script::~Script(&local_210);
      local_2a0._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_006a68b0;
      std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                (&local_228);
      cfd::core::TapBranch::~TapBranch(&local_2a0);
      if (local_2b8 != (pointer)0x0) {
        operator_delete(local_2b8);
      }
      if (local_2d0 != (pointer)0x0) {
        operator_delete(local_2d0);
      }
      if (local_2e8 != (pointer)0x0) {
        operator_delete(local_2e8);
      }
      if ((char *)local_308._M_allocated_capacity != local_2f8) {
        operator_delete((void *)local_308._M_allocated_capacity);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_338._M_dataplus._M_p != paVar3) {
        operator_delete(local_338._M_dataplus._M_p);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_318);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_338,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x1c3,
               "Expected: (address = Address(\"bcrt1pzamhq9jglfxaj0r5ahvatr8uc77u973s5tm04yytdltsey5r8nasmsdlvq\")) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_338,(Message *)local_318);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_338);
    if (local_318 != (undefined1  [8])0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_318 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_318 + 8))();
      }
      local_318 = (undefined1  [8])0x0;
    }
  }
  cfd::core::Address::GetAddress_abi_cxx11_((string *)local_318,&local_1a0);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_338,
             "\"bcrt1pzamhq9jglfxaj0r5ahvatr8uc77u973s5tm04yytdltsey5r8nasmsdlvq\"",
             "address.GetAddress().c_str()",
             "bcrt1pzamhq9jglfxaj0r5ahvatr8uc77u973s5tm04yytdltsey5r8nasmsdlvq",(char *)local_318);
  if (local_318 != (undefined1  [8])&local_308) {
    operator_delete((void *)local_318);
  }
  if ((char)local_338._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_318);
    if ((undefined8 *)local_338._M_string_length == (undefined8 *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)local_338._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x1c5,pcVar6);
    testing::internal::AssertHelper::operator=(&local_348,(Message *)local_318);
    testing::internal::AssertHelper::~AssertHelper(&local_348);
    if (local_318 != (undefined1  [8])0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_318 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_318 + 8))();
      }
      local_318 = (undefined1  [8])0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_338._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_338._M_dataplus._M_p._0_4_ = 2;
  local_348.data_._0_4_ = local_1a0.type_;
  testing::internal::CmpHelperEQ<cfd::core::NetType,cfd::core::NetType>
            ((internal *)local_318,"NetType::kRegtest","address.GetNetType()",(NetType *)&local_338,
             (NetType *)&local_348);
  if (local_318[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_338);
    if (local_310.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((local_310.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x1c6,pcVar6);
    testing::internal::AssertHelper::operator=(&local_348,(Message *)&local_338);
    testing::internal::AssertHelper::~AssertHelper(&local_348);
    if ((long *)local_338._M_dataplus._M_p != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_338._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_338._M_dataplus._M_p + 8))();
      }
      local_338._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_310,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_338._M_dataplus._M_p._0_4_ = 7;
  local_348.data_._0_4_ = local_1a0.addr_type_;
  testing::internal::CmpHelperEQ<cfd::core::AddressType,cfd::core::AddressType>
            ((internal *)local_318,"AddressType::kTaprootAddress","address.GetAddressType()",
             (AddressType *)&local_338,(AddressType *)&local_348);
  if (local_318[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_338);
    if (local_310.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((local_310.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x1c7,pcVar6);
    testing::internal::AssertHelper::operator=(&local_348,(Message *)&local_338);
    testing::internal::AssertHelper::~AssertHelper(&local_348);
    if ((long *)local_338._M_dataplus._M_p != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_338._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_338._M_dataplus._M_p + 8))();
      }
      local_338._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_310,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_338._M_dataplus._M_p._0_4_ = 1;
  local_348.data_._0_4_ = local_1a0.witness_ver_;
  testing::internal::CmpHelperEQ<cfd::core::WitnessVersion,cfd::core::WitnessVersion>
            ((internal *)local_318,"WitnessVersion::kVersion1","address.GetWitnessVersion()",
             (WitnessVersion *)&local_338,(WitnessVersion *)&local_348);
  if (local_318[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_338);
    if (local_310.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((local_310.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x1c8,pcVar6);
    testing::internal::AssertHelper::operator=(&local_348,(Message *)&local_338);
    testing::internal::AssertHelper::~AssertHelper(&local_348);
    if ((long *)local_338._M_dataplus._M_p != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_338._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_338._M_dataplus._M_p + 8))();
      }
      local_338._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_310,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_338._M_dataplus._M_p = (pointer)0x0;
  local_338._M_string_length = 0;
  local_338.field_2._M_allocated_capacity = 0;
  uVar4 = (long)local_1a0.hash_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_1a0.hash_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (uVar4 == 0) {
    pcVar2 = (pointer)0x0;
  }
  else {
    if ((long)uVar4 < 0) {
      std::__throw_bad_alloc();
    }
    pcVar2 = (pointer)operator_new(uVar4);
  }
  local_338.field_2._M_allocated_capacity = (size_type)(pcVar2 + uVar4);
  sVar5 = (long)local_1a0.hash_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_1a0.hash_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  local_338._M_dataplus._M_p = pcVar2;
  if (sVar5 != 0) {
    local_338._M_string_length = (size_type)pcVar2;
    memmove(pcVar2,local_1a0.hash_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,sVar5);
  }
  local_338._M_string_length = (size_type)(pcVar2 + sVar5);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_318,(ByteData *)&local_338);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_348,
             "\"1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb\"",
             "address.GetHash().GetHex().c_str()",
             "1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb",(char *)local_318);
  if (local_318 != (undefined1  [8])&local_308) {
    operator_delete((void *)local_318);
  }
  if (local_338._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_338._M_dataplus._M_p);
  }
  if (local_348.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_318);
    if (local_340.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((local_340.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_338,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x1ca,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_338,(Message *)local_318);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_338);
    if (local_318 != (undefined1  [8])0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_318 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_318 + 8))();
      }
      local_318 = (undefined1  [8])0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_340,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_338._M_dataplus._M_p = (pointer)0x0;
  local_338._M_string_length = 0;
  local_338.field_2._M_allocated_capacity = 0;
  uVar4 = (long)local_1a0.schnorr_pubkey_.data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_1a0.schnorr_pubkey_.data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (uVar4 == 0) {
    __dest = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
  }
  else {
    if ((long)uVar4 < 0) {
      std::__throw_bad_alloc();
    }
    __dest = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)operator_new(uVar4);
  }
  local_338.field_2._M_allocated_capacity = uVar4 + (long)__dest;
  sVar5 = (long)local_1a0.schnorr_pubkey_.data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_1a0.schnorr_pubkey_.data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  local_338._M_dataplus._M_p = (pointer)__dest;
  if (sVar5 != 0) {
    local_338._M_string_length = (size_type)__dest;
    memmove(__dest,local_1a0.schnorr_pubkey_.data_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,sVar5);
  }
  local_338._M_string_length = (long)__dest + sVar5;
  cfd::core::SchnorrPubkey::GetHex_abi_cxx11_((string *)local_318,(SchnorrPubkey *)&local_338);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_348,
             "\"1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb\"",
             "address.GetSchnorrPubkey().GetHex().c_str()",
             "1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb",(char *)local_318);
  if (local_318 != (undefined1  [8])&local_308) {
    operator_delete((void *)local_318);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_338._M_dataplus._M_p);
  }
  if (local_348.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_318);
    if (local_340.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((local_340.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_338,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x1cc,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_338,(Message *)local_318);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_338);
    if (local_318 != (undefined1  [8])0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_318 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_318 + 8))();
      }
      local_318 = (undefined1  [8])0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_340,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    local_338._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_338,"bcrt1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5u4fujx6","");
    cfd::core::Address::Address((Address *)local_318,&local_338);
    cfd::core::Address::operator=(&local_1a0,(Address *)local_318);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_1d0);
    cfd::core::Script::~Script(&local_210);
    local_2a0._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_006a68b0;
    std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
              (&local_228);
    cfd::core::TapBranch::~TapBranch(&local_2a0);
    if (local_2b8 != (pointer)0x0) {
      operator_delete(local_2b8);
    }
    if (local_2d0 != (pointer)0x0) {
      operator_delete(local_2d0);
    }
    if (local_2e8 != (pointer)0x0) {
      operator_delete(local_2e8);
    }
    if ((char *)local_308._M_allocated_capacity != local_2f8) {
      operator_delete((void *)local_308._M_allocated_capacity);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338._M_dataplus._M_p != paVar3) {
      operator_delete(local_338._M_dataplus._M_p);
    }
  }
  testing::Message::Message((Message *)local_318);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_338,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
             ,0x1d0,
             "Expected: (address = Address(\"bcrt1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5u4fujx6\")) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_338,(Message *)local_318);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_338);
  if (local_318 != (undefined1  [8])0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) && (local_318 != (undefined1  [8])0x0)) {
      (**(code **)(*(size_type *)local_318 + 8))();
    }
    local_318 = (undefined1  [8])0x0;
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_1a0.format_data_);
  cfd::core::Script::~Script(&local_1a0.redeem_script_);
  local_1a0.script_tree_.super_TapBranch._vptr_TapBranch =
       (_func_int **)&PTR__TaprootScriptTree_006a68b0;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
            (&local_1a0.script_tree_.nodes_);
  cfd::core::TapBranch::~TapBranch(&local_1a0.script_tree_.super_TapBranch);
  if (local_1a0.schnorr_pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1a0.schnorr_pubkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_1a0.pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1a0.pubkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_1a0.hash_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1a0.hash_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0.address_._M_dataplus._M_p != &local_1a0.address_.field_2) {
    operator_delete(local_1a0.address_._M_dataplus._M_p);
  }
  return;
}

Assistant:

TEST(Address, SegwitAddressFromStringTest) {
  Address address;
  EXPECT_NO_THROW((address = Address("bc1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5uax7v9q")));
  EXPECT_STREQ("bc1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5uax7v9q",
               address.GetAddress().c_str());
  EXPECT_EQ(NetType::kMainnet, address.GetNetType());
  EXPECT_EQ(AddressType::kP2wpkhAddress, address.GetAddressType());
  EXPECT_EQ(WitnessVersion::kVersion0, address.GetWitnessVersion());
  EXPECT_STREQ("925d4028880bd0c9d68fbc7fc7dfee976698629c",
               address.GetHash().GetHex().c_str());
  EXPECT_STREQ("", address.GetPubkey().GetHex().c_str());
  EXPECT_STREQ("", address.GetScript().GetHex().c_str());

  EXPECT_NO_THROW((address = Address("tb1qcc5c9wnzly8zj2dcsvxv83kupsu0uamx69u0y9lsmw7shuns2gqs44ltpt")));
  EXPECT_STREQ("tb1qcc5c9wnzly8zj2dcsvxv83kupsu0uamx69u0y9lsmw7shuns2gqs44ltpt",
               address.GetAddress().c_str());
  EXPECT_EQ(NetType::kTestnet, address.GetNetType());
  EXPECT_EQ(AddressType::kP2wshAddress, address.GetAddressType());
  EXPECT_EQ(WitnessVersion::kVersion0, address.GetWitnessVersion());

  EXPECT_NO_THROW((address = Address("bcrt1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5u4fujf6")));
  EXPECT_STREQ("bcrt1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5u4fujf6",
               address.GetAddress().c_str());
  EXPECT_EQ(NetType::kRegtest, address.GetNetType());
  EXPECT_EQ(AddressType::kP2wpkhAddress, address.GetAddressType());
  EXPECT_EQ(WitnessVersion::kVersion0, address.GetWitnessVersion());

  EXPECT_NO_THROW((address = Address("bcrt1pzamhq9jglfxaj0r5ahvatr8uc77u973s5tm04yytdltsey5r8nasmsdlvq")));
  EXPECT_STREQ("bcrt1pzamhq9jglfxaj0r5ahvatr8uc77u973s5tm04yytdltsey5r8nasmsdlvq",
               address.GetAddress().c_str());
  EXPECT_EQ(NetType::kRegtest, address.GetNetType());
  EXPECT_EQ(AddressType::kTaprootAddress, address.GetAddressType());
  EXPECT_EQ(WitnessVersion::kVersion1, address.GetWitnessVersion());
  EXPECT_STREQ("1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb",
              address.GetHash().GetHex().c_str());
  EXPECT_STREQ("1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb",
              address.GetSchnorrPubkey().GetHex().c_str());

  // Illegal data
  EXPECT_THROW((address = Address("bcrt1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5u4fujx6")),
               CfdException);
}